

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> * __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::operator=
          (ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>
           *this,ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>
                 *other)

{
  ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *other_local
  ;
  ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (DataLocationUsage *)0x0;
  other->pos = (RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>
                *)0x0;
  other->endPtr = (DataLocationUsage *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }